

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.cpp
# Opt level: O3

path * __thiscall
Process::Normalise(path *__return_storage_ptr__,Process *this,int fd,path *path,path *cwd)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  bool bVar5;
  path *ppVar6;
  path p;
  error_code ec;
  path canonical;
  path fullPath;
  path canonicalParent;
  path file;
  path parent;
  path local_100;
  undefined4 local_e0;
  char local_dc;
  system_error_category *local_d8;
  path local_d0;
  path local_b0;
  path local_90;
  path local_70;
  path local_50;
  
  local_e0 = 0;
  local_dc = '\0';
  local_d8 = &boost::system::detail::cat_holder<void>::system_category_instance;
  paVar2 = &local_b0.m_pathname.field_2;
  local_b0.m_pathname._M_string_length = 0;
  local_b0.m_pathname.field_2._M_local_buf[0] = '\0';
  local_b0.m_pathname._M_dataplus._M_p = (pointer)paVar2;
  bVar5 = boost::filesystem::path::has_root_directory(path);
  if (bVar5) {
    std::__cxx11::string::_M_assign((string *)&local_b0);
LAB_0010a791:
    boost::filesystem::detail::current_path((error_code *)&local_100);
    if (local_dc == '\x01') {
      local_d0.m_pathname._M_dataplus._M_p = (pointer)&local_d0.m_pathname.field_2;
      local_d0.m_pathname._M_string_length = 0;
      local_d0.m_pathname.field_2._M_local_buf[0] = '\0';
    }
    else {
      boost::filesystem::detail::canonical(&local_d0,&local_b0,(error_code *)&local_100);
    }
    paVar1 = &local_100.m_pathname.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100.m_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_100.m_pathname._M_dataplus._M_p,
                      local_100.m_pathname.field_2._M_allocated_capacity + 1);
    }
    if (local_dc == '\0') {
      (__return_storage_ptr__->m_pathname)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_pathname).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,local_d0.m_pathname._M_dataplus._M_p,
                 local_d0.m_pathname._M_dataplus._M_p +
                 (long)(_func_int ***)local_d0.m_pathname._M_string_length);
    }
    else {
      boost::filesystem::path::parent_path();
      boost::filesystem::path::filename();
      boost::filesystem::detail::current_path((error_code *)&local_100);
      if (local_dc == '\x01') {
        local_90.m_pathname._M_dataplus._M_p = (pointer)&local_90.m_pathname.field_2;
        local_90.m_pathname._M_string_length = 0;
        local_90.m_pathname.field_2._M_local_buf[0] = '\0';
      }
      else {
        boost::filesystem::detail::canonical(&local_90,&local_50,(error_code *)&local_100);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100.m_pathname._M_dataplus._M_p != paVar1) {
        operator_delete(local_100.m_pathname._M_dataplus._M_p,
                        local_100.m_pathname.field_2._M_allocated_capacity + 1);
      }
      if (local_dc == '\0') {
        (__return_storage_ptr__->m_pathname)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_pathname).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,local_90.m_pathname._M_dataplus._M_p,
                   local_90.m_pathname._M_dataplus._M_p + local_90.m_pathname._M_string_length);
        boost::filesystem::path::operator/=(__return_storage_ptr__,&local_70);
      }
      else {
        paVar1 = &(__return_storage_ptr__->m_pathname).field_2;
        (__return_storage_ptr__->m_pathname)._M_dataplus._M_p = (pointer)paVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0.m_pathname._M_dataplus._M_p == paVar2) {
          paVar1->_M_allocated_capacity =
               CONCAT71(local_b0.m_pathname.field_2._M_allocated_capacity._1_7_,
                        local_b0.m_pathname.field_2._M_local_buf[0]);
          *(undefined8 *)((long)&(__return_storage_ptr__->m_pathname).field_2 + 8) =
               local_b0.m_pathname.field_2._8_8_;
        }
        else {
          (__return_storage_ptr__->m_pathname)._M_dataplus._M_p =
               local_b0.m_pathname._M_dataplus._M_p;
          (__return_storage_ptr__->m_pathname).field_2._M_allocated_capacity =
               CONCAT71(local_b0.m_pathname.field_2._M_allocated_capacity._1_7_,
                        local_b0.m_pathname.field_2._M_local_buf[0]);
        }
        (__return_storage_ptr__->m_pathname)._M_string_length = local_b0.m_pathname._M_string_length
        ;
        local_b0.m_pathname._M_string_length = 0;
        local_b0.m_pathname.field_2._M_local_buf[0] = '\0';
        local_b0.m_pathname._M_dataplus._M_p = (pointer)paVar2;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90.m_pathname._M_dataplus._M_p != &local_90.m_pathname.field_2) {
        operator_delete(local_90.m_pathname._M_dataplus._M_p,
                        CONCAT71(local_90.m_pathname.field_2._M_allocated_capacity._1_7_,
                                 local_90.m_pathname.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.m_pathname._M_dataplus._M_p != &local_70.m_pathname.field_2) {
        operator_delete(local_70.m_pathname._M_dataplus._M_p,
                        local_70.m_pathname.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50.m_pathname._M_dataplus._M_p != &local_50.m_pathname.field_2) {
        operator_delete(local_50.m_pathname._M_dataplus._M_p,
                        local_50.m_pathname.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.m_pathname._M_dataplus._M_p == &local_d0.m_pathname.field_2) goto LAB_0010aa65;
  }
  else {
    if (fd == -100) {
      paVar1 = &local_100.m_pathname.field_2;
      pcVar4 = (cwd->m_pathname)._M_dataplus._M_p;
      local_100.m_pathname._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_100,pcVar4,pcVar4 + (cwd->m_pathname)._M_string_length);
      boost::filesystem::path::operator/=(&local_100,path);
      boost::filesystem::path::normalize(&local_100);
      std::__cxx11::string::_M_assign((string *)&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100.m_pathname._M_dataplus._M_p != paVar1) {
        operator_delete(local_100.m_pathname._M_dataplus._M_p,
                        local_100.m_pathname.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0010a791;
    }
    GetFd(&local_d0,this,fd);
    boost::filesystem::path::operator/=(&local_d0,path);
    paVar1 = &local_100.m_pathname.field_2;
    paVar3 = &local_d0.m_pathname.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.m_pathname._M_dataplus._M_p == paVar3) {
      local_100.m_pathname.field_2._8_8_ = local_d0.m_pathname.field_2._8_8_;
      local_100.m_pathname._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_100.m_pathname._M_dataplus._M_p = local_d0.m_pathname._M_dataplus._M_p;
    }
    local_100.m_pathname.field_2._M_allocated_capacity._1_7_ =
         local_d0.m_pathname.field_2._M_allocated_capacity._1_7_;
    local_100.m_pathname.field_2._M_local_buf[0] = local_d0.m_pathname.field_2._M_local_buf[0];
    local_100.m_pathname._M_string_length = local_d0.m_pathname._M_string_length;
    local_d0.m_pathname._M_string_length = 0;
    local_d0.m_pathname.field_2._M_local_buf[0] = '\0';
    local_d0.m_pathname._M_dataplus._M_p = (pointer)paVar3;
    ppVar6 = boost::filesystem::path::normalize(&local_100);
    (__return_storage_ptr__->m_pathname)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_pathname).field_2;
    pcVar4 = (ppVar6->m_pathname)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar4,
               pcVar4 + (ppVar6->m_pathname)._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100.m_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_100.m_pathname._M_dataplus._M_p,
                      local_100.m_pathname.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.m_pathname._M_dataplus._M_p == paVar3) goto LAB_0010aa65;
  }
  operator_delete(local_d0.m_pathname._M_dataplus._M_p,
                  CONCAT71(local_d0.m_pathname.field_2._M_allocated_capacity._1_7_,
                           local_d0.m_pathname.field_2._M_local_buf[0]) + 1);
LAB_0010aa65:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.m_pathname._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0.m_pathname._M_dataplus._M_p,
                    CONCAT71(local_b0.m_pathname.field_2._M_allocated_capacity._1_7_,
                             local_b0.m_pathname.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

fs::path Process::Normalise(int fd, const fs::path &path, const fs::path &cwd)
{
  boost::system::error_code ec;

  // Get rid of the relative path.
  fs::path fullPath;
  if (path.is_relative()) {
    if (fd == AT_FDCWD) {
      fullPath = (cwd / path).normalize();
    } else {
      return (GetFd(fd) / path).normalize();
    }
  } else {
    fullPath = path;
  }

  // If the file exists, return the canonical path.
  const fs::path canonical = fs::canonical(fullPath, ec);
  if (!ec) {
    return canonical;
  }

  // If the file was deleted, try to canonicalise the parent.
  const fs::path parent = fullPath.parent_path();
  const fs::path file = fullPath.filename();

  const fs::path canonicalParent = fs::canonical(parent, ec);
  if (!ec) {
    return canonicalParent / file;
  }

  return fullPath;
}